

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.h
# Opt level: O3

void __thiscall google::protobuf::util::converter::JsonObjectWriter::Pop(JsonObjectWriter *this)

{
  char cVar1;
  BaseElement *this_00;
  Element *pEVar2;
  Element *pEVar3;
  
  this_00 = &((this->element_)._M_t.
              super___uniq_ptr_impl<google::protobuf::util::converter::JsonObjectWriter::Element,_std::default_delete<google::protobuf::util::converter::JsonObjectWriter::Element>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::util::converter::JsonObjectWriter::Element_*,_std::default_delete<google::protobuf::util::converter::JsonObjectWriter::Element>_>
              .
              super__Head_base<0UL,_google::protobuf::util::converter::JsonObjectWriter::Element_*,_false>
             ._M_head_impl)->super_BaseElement;
  cVar1 = this_00->field_0x14;
  if (cVar1 == '\x01') {
    this_00->field_0x14 = 0;
  }
  pEVar3 = StructuredObjectWriter::BaseElement::
           pop<google::protobuf::util::converter::JsonObjectWriter::Element>(this_00);
  pEVar2 = (this->element_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::JsonObjectWriter::Element,_std::default_delete<google::protobuf::util::converter::JsonObjectWriter::Element>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::JsonObjectWriter::Element_*,_std::default_delete<google::protobuf::util::converter::JsonObjectWriter::Element>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::JsonObjectWriter::Element_*,_false>
           ._M_head_impl;
  (this->element_)._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::JsonObjectWriter::Element,_std::default_delete<google::protobuf::util::converter::JsonObjectWriter::Element>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::JsonObjectWriter::Element_*,_std::default_delete<google::protobuf::util::converter::JsonObjectWriter::Element>_>
  .super__Head_base<0UL,_google::protobuf::util::converter::JsonObjectWriter::Element_*,_false>.
  _M_head_impl = pEVar3;
  if (pEVar2 != (Element *)0x0) {
    (**(code **)((long)(pEVar2->super_BaseElement)._vptr_BaseElement + 8))();
  }
  if (cVar1 != '\0') {
    return;
  }
  NewLine(this);
  return;
}

Assistant:

void Pop() {
    bool needs_newline = !element_->is_first();
    element_.reset(element_->pop<Element>());
    if (needs_newline) NewLine();
  }